

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

size_t __thiscall
google::protobuf::UnknownFieldSet::SpaceUsedExcludingSelfLong(UnknownFieldSet *this)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  UnknownField *field;
  char *pcVar7;
  
  iVar1 = internal::SooRep::size
                    ((SooRep *)this,
                     (undefined1  [16])
                     ((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4) ==
                     (undefined1  [16])0x0);
  sVar5 = 0;
  if (iVar1 != 0) {
    uVar6 = (this->fields_).soo_rep_.field_0.long_rep.elements_int;
    iVar1 = 0;
    if ((uVar6 & 4) != 0) {
      iVar1 = (this->fields_).soo_rep_.field_0.long_rep.capacity;
    }
    if (0 < iVar1) {
      sVar5 = (long)iVar1 * 0x10 + 0x10;
    }
    if ((uVar6 & 4) == 0) {
      pcVar7 = (char *)((long)&(this->fields_).soo_rep_.field_0 + 8);
    }
    else {
      pcVar7 = internal::LongSooRep::elements((LongSooRep *)this);
      uVar6 = (this->fields_).soo_rep_.field_0.long_rep.elements_int;
    }
    if ((uVar6 & 4) == 0) {
      pcVar3 = (char *)((long)&(this->fields_).soo_rep_.field_0 + 8);
    }
    else {
      pcVar3 = internal::LongSooRep::elements((LongSooRep *)this);
    }
    iVar1 = internal::SooRep::size((SooRep *)this,(uVar6 & 4) == 0);
    for (; pcVar7 != pcVar3 + (long)iVar1 * 0x10; pcVar7 = pcVar7 + 0x10) {
      if (*(int *)(pcVar7 + 4) == 4) {
        iVar2 = SpaceUsedExcludingSelf(*(UnknownFieldSet **)(pcVar7 + 8));
        sVar5 = sVar5 + (long)iVar2 + 0x10;
      }
      else if (*(int *)(pcVar7 + 4) == 3) {
        sVar4 = internal::StringSpaceUsedExcludingSelfLong(*(string **)(pcVar7 + 8));
        sVar5 = sVar5 + sVar4 + 0x20;
      }
    }
  }
  return sVar5;
}

Assistant:

size_t UnknownFieldSet::SpaceUsedExcludingSelfLong() const {
  if (fields_.empty()) return 0;

  size_t total_size = fields_.SpaceUsedExcludingSelfLong();

  for (const UnknownField& field : fields_) {
    switch (field.type()) {
      case UnknownField::TYPE_LENGTH_DELIMITED:
        total_size += sizeof(*field.data_.string_value) +
                      internal::StringSpaceUsedExcludingSelfLong(
                          *field.data_.string_value);
        break;
      case UnknownField::TYPE_GROUP:
        total_size += field.data_.group->SpaceUsedLong();
        break;
      default:
        break;
    }
  }
  return total_size;
}